

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O0

Test * MissingDependencyScannerTestMissingDepFixedDirect::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x410);
  MissingDependencyScannerTestMissingDepFixedDirect
            ((MissingDependencyScannerTestMissingDepFixedDirect *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(MissingDependencyScannerTest, MissingDepFixedDirect) {
  CreateInitialState();
  // Adding the direct dependency fixes the missing dep
  CreateGraphDependencyBetween("compiled_object", "generated_header");
  RecordDepsLogDep("compiled_object", "generated_header");
  ProcessAllNodes();
  ASSERT_FALSE(scanner().HadMissingDeps());
}